

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O3

double3 * tinyusdz::geometric_normal(double3 *p0,double3 *p1,double3 *p2)

{
  undefined1 auVar1 [16];
  double3 *in_RDI;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar2 = p1->_M_elems[0] - p0->_M_elems[0];
  dVar5 = p1->_M_elems[1] - p0->_M_elems[1];
  dVar6 = p1->_M_elems[2] - p0->_M_elems[2];
  dVar4 = p2->_M_elems[1] - p0->_M_elems[1];
  dVar7 = p2->_M_elems[2] - p0->_M_elems[2];
  dVar8 = p2->_M_elems[0] - p0->_M_elems[0];
  auVar3._0_8_ = dVar5 * dVar7 - dVar4 * dVar6;
  auVar3._8_8_ = dVar6 * dVar8 - dVar7 * dVar2;
  dVar2 = dVar2 * dVar4 - dVar8 * dVar5;
  dVar4 = dVar2 * dVar2 + auVar3._0_8_ * auVar3._0_8_ + auVar3._8_8_ * auVar3._8_8_;
  dVar4 = (double)(-(ulong)(2.220446049250313e-16 < dVar4) & (ulong)SQRT(dVar4));
  if (dVar4 <= 2.220446049250313e-16) {
    dVar4 = 2.220446049250313e-16;
  }
  auVar1._8_8_ = dVar4;
  auVar1._0_8_ = dVar4;
  auVar3 = divpd(auVar3,auVar1);
  *(undefined1 (*) [16])in_RDI->_M_elems = auVar3;
  in_RDI->_M_elems[2] = dVar2 / dVar4;
  return in_RDI;
}

Assistant:

value::double3 geometric_normal(const value::double3 &p0, const value::double3 &p1, const value::double3 &p2)
{
  value::double3 n = vcross(p1 - p0, p2 - p0);

  return vnormalize(n);
}